

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int mbedtls_x509write_crt_set_authority_key_identifier(mbedtls_x509write_cert *ctx)

{
  long lVar1;
  size_t sVar2;
  size_t len;
  uchar *c;
  uchar buf [2068];
  int ret;
  mbedtls_x509write_cert *ctx_local;
  
  len = (size_t)(buf + 0x80c);
  memset(&c,0,0x814);
  ctx_local._4_4_ = mbedtls_pk_write_pubkey((uchar **)&len,(uchar *)&c,ctx->issuer_key);
  if (-1 < ctx_local._4_4_) {
    mbedtls_sha1(buf + (0x80c - (long)ctx_local._4_4_),(long)ctx_local._4_4_,buf + 0x7f8);
    len = (size_t)(buf + 0x7f8);
    ctx_local._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)&c,0x14);
    if (-1 < ctx_local._4_4_) {
      lVar1 = (long)ctx_local._4_4_;
      ctx_local._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)&c,0x80);
      if (-1 < ctx_local._4_4_) {
        sVar2 = (long)ctx_local._4_4_ + lVar1 + 0x14;
        ctx_local._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)&c,sVar2);
        if (-1 < ctx_local._4_4_) {
          lVar1 = (long)ctx_local._4_4_;
          ctx_local._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)&c,'0');
          if (-1 < ctx_local._4_4_) {
            sVar2 = (long)ctx_local._4_4_ + lVar1 + sVar2;
            ctx_local._4_4_ =
                 mbedtls_x509write_crt_set_extension(ctx,"U\x1d#",3,0,buf + (0x80c - sVar2),sVar2);
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_crt_set_authority_key_identifier( mbedtls_x509write_cert *ctx )
{
    int ret;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE * 2 + 20]; /* tag, length + 2xMPI */
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, ctx->issuer_key ) );

    mbedtls_sha1( buf + sizeof(buf) - len, len, buf + sizeof(buf) - 20 );
    c = buf + sizeof(buf) - 20;
    len = 20;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC | 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_AUTHORITY_KEY_IDENTIFIER,
                                   MBEDTLS_OID_SIZE( MBEDTLS_OID_AUTHORITY_KEY_IDENTIFIER ),
                                   0, buf + sizeof(buf) - len, len );
}